

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testInvalidLoop2(void)

{
  RepeatedField<long> *this;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  Rep *pRVar4;
  ulong uVar5;
  ConvolutionLayerParams *pCVar6;
  TypeUnion TVar7;
  bool bVar8;
  FeatureType *pFVar9;
  ArrayFeatureType *pAVar10;
  long *plVar11;
  FeatureDescription *pFVar12;
  GreaterThanLayerParams *pGVar13;
  ActivationParams *pAVar14;
  ActivationReLU *pAVar15;
  LoopLayerParams *pLVar16;
  NeuralNetwork *pNVar17;
  NeuralNetworkLayer *pNVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  void *pvVar20;
  CopyLayerParams *pCVar21;
  ostream *poVar22;
  long lVar23;
  undefined8 *puVar24;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar25;
  Arena *pAVar26;
  Model m;
  Result res;
  NeuralNetwork nnBody;
  NeuralNetwork nnCondition;
  Model local_120;
  Result local_f0;
  NeuralNetwork local_c8;
  NeuralNetwork local_70;
  
  CoreML::Specification::Model::Model(&local_120,(Arena *)0x0,false);
  if (local_120.description_ == (ModelDescription *)0x0) {
    pAVar26 = (Arena *)(local_120.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_120.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    local_120.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar26);
  }
  pRVar4 = ((local_120.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001ac97f:
    pRVar25 = &(local_120.description_)->input_;
    pFVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar25->super_RepeatedPtrFieldBase).arena_);
    pvVar20 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar25->super_RepeatedPtrFieldBase,pFVar12);
  }
  else {
    iVar1 = ((local_120.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001ac97f;
    ((local_120.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar20 = pRVar4->elements[iVar1];
  }
  puVar24 = (undefined8 *)(*(ulong *)((long)pvVar20 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar20 + 8) & 1) != 0) {
    puVar24 = (undefined8 *)*puVar24;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar20 + 0x10),"A",puVar24);
  if (*(long *)((long)pvVar20 + 0x20) == 0) {
    pAVar26 = (Arena *)(*(ulong *)((long)pvVar20 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar20 + 8) & 1) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar26);
    *(FeatureType **)((long)pvVar20 + 0x20) = pFVar9;
  }
  pFVar9 = *(FeatureType **)((long)pvVar20 + 0x20);
  if (pFVar9->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    uVar5 = (pFVar9->super_MessageLite)._internal_metadata_.ptr_;
    pAVar26 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    pAVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar26);
    (pFVar9->Type_).multiarraytype_ = pAVar10;
  }
  if (*(long *)((long)pvVar20 + 0x20) == 0) {
    pAVar26 = (Arena *)(*(ulong *)((long)pvVar20 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar20 + 8) & 1) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar26);
    *(FeatureType **)((long)pvVar20 + 0x20) = pFVar9;
  }
  pFVar9 = *(FeatureType **)((long)pvVar20 + 0x20);
  if (pFVar9->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    uVar5 = (pFVar9->super_MessageLite)._internal_metadata_.ptr_;
    pAVar26 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    pAVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar26);
    (pFVar9->Type_).multiarraytype_ = pAVar10;
  }
  pAVar10 = (pFVar9->Type_).multiarraytype_;
  this = &pAVar10->shape_;
  uVar2 = (pAVar10->shape_).current_size_;
  uVar3 = (pAVar10->shape_).total_size_;
  if (uVar2 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar11 = google::protobuf::RepeatedField<long>::elements(this);
  plVar11[uVar2] = 1;
  this->current_size_ = uVar2 + 1;
  if (local_120.description_ == (ModelDescription *)0x0) {
    pAVar26 = (Arena *)(local_120.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_120.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    local_120.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar26);
  }
  pRVar4 = ((local_120.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001acaeb:
    pRVar25 = &(local_120.description_)->output_;
    pFVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar25->super_RepeatedPtrFieldBase).arena_);
    pvVar20 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar25->super_RepeatedPtrFieldBase,pFVar12);
  }
  else {
    iVar1 = ((local_120.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001acaeb;
    ((local_120.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar20 = pRVar4->elements[iVar1];
  }
  puVar24 = (undefined8 *)(*(ulong *)((long)pvVar20 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar20 + 8) & 1) != 0) {
    puVar24 = (undefined8 *)*puVar24;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar20 + 0x10),"B",puVar24);
  if (*(long *)((long)pvVar20 + 0x20) == 0) {
    pAVar26 = (Arena *)(*(ulong *)((long)pvVar20 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar20 + 8) & 1) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar26);
    *(FeatureType **)((long)pvVar20 + 0x20) = pFVar9;
  }
  pFVar9 = *(FeatureType **)((long)pvVar20 + 0x20);
  if (pFVar9->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    uVar5 = (pFVar9->super_MessageLite)._internal_metadata_.ptr_;
    pAVar26 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    pAVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar26);
    (pFVar9->Type_).multiarraytype_ = pAVar10;
  }
  CoreML::Specification::NeuralNetwork::NeuralNetwork(&local_70,(Arena *)0x0,false);
  if (local_70.layers_.super_RepeatedPtrFieldBase.rep_ == (Rep *)0x0) {
LAB_001acbbb:
    pNVar18 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        (local_70.layers_.super_RepeatedPtrFieldBase.arena_);
    pNVar18 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&local_70.layers_.super_RepeatedPtrFieldBase,pNVar18);
  }
  else {
    lVar23 = (long)local_70.layers_.super_RepeatedPtrFieldBase.current_size_;
    if ((local_70.layers_.super_RepeatedPtrFieldBase.rep_)->allocated_size <=
        local_70.layers_.super_RepeatedPtrFieldBase.current_size_) goto LAB_001acbbb;
    local_70.layers_.super_RepeatedPtrFieldBase.current_size_ =
         local_70.layers_.super_RepeatedPtrFieldBase.current_size_ + 1;
    pNVar18 = (NeuralNetworkLayer *)
              (local_70.layers_.super_RepeatedPtrFieldBase.rep_)->elements[lVar23];
  }
  if (pNVar18->_oneof_case_[0] != 0x33e) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar18);
    pNVar18->_oneof_case_[0] = 0x33e;
    uVar5 = (pNVar18->super_MessageLite)._internal_metadata_.ptr_;
    pAVar26 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    pGVar13 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::GreaterThanLayerParams>(pAVar26);
    (pNVar18->layer_).greaterthan_ = pGVar13;
  }
  (((pNVar18->layer_).convolution_)->kernelsize_).current_size_ = 0x3f800000;
  uVar5 = (pNVar18->super_MessageLite)._internal_metadata_.ptr_;
  puVar24 = (undefined8 *)(uVar5 & 0xfffffffffffffffc);
  if ((uVar5 & 1) != 0) {
    puVar24 = (undefined8 *)*puVar24;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar18->name_,"cond",puVar24);
  pRVar4 = (pNVar18->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001acc67:
    pbVar19 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar18->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar20 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar18->input_).super_RepeatedPtrFieldBase,pbVar19);
  }
  else {
    iVar1 = (pNVar18->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001acc67;
    (pNVar18->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar20 = pRVar4->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar20,0,*(char **)((long)pvVar20 + 8),0x3b8534);
  pRVar4 = (pNVar18->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001accb7:
    pbVar19 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar18->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar20 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar18->output_).super_RepeatedPtrFieldBase,pbVar19);
  }
  else {
    iVar1 = (pNVar18->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001accb7;
    (pNVar18->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar20 = pRVar4->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar20,0,*(char **)((long)pvVar20 + 8),0x3b8bcb);
  CoreML::Specification::NeuralNetwork::NeuralNetwork(&local_c8,(Arena *)0x0,false);
  if (local_c8.layers_.super_RepeatedPtrFieldBase.rep_ == (Rep *)0x0) {
LAB_001acd1b:
    pNVar18 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        (local_c8.layers_.super_RepeatedPtrFieldBase.arena_);
    pNVar18 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&local_c8.layers_.super_RepeatedPtrFieldBase,pNVar18);
  }
  else {
    lVar23 = (long)local_c8.layers_.super_RepeatedPtrFieldBase.current_size_;
    if ((local_c8.layers_.super_RepeatedPtrFieldBase.rep_)->allocated_size <=
        local_c8.layers_.super_RepeatedPtrFieldBase.current_size_) goto LAB_001acd1b;
    local_c8.layers_.super_RepeatedPtrFieldBase.current_size_ =
         local_c8.layers_.super_RepeatedPtrFieldBase.current_size_ + 1;
    pNVar18 = (NeuralNetworkLayer *)
              (local_c8.layers_.super_RepeatedPtrFieldBase.rep_)->elements[lVar23];
  }
  if (pNVar18->_oneof_case_[0] != 0x82) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar18);
    pNVar18->_oneof_case_[0] = 0x82;
    uVar5 = (pNVar18->super_MessageLite)._internal_metadata_.ptr_;
    pAVar26 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    pAVar14 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ActivationParams>
                        (pAVar26);
    (pNVar18->layer_).activation_ = pAVar14;
  }
  pAVar14 = (pNVar18->layer_).activation_;
  if (pAVar14->_oneof_case_[0] != 10) {
    CoreML::Specification::ActivationParams::clear_NonlinearityType(pAVar14);
    pAVar14->_oneof_case_[0] = 10;
    uVar5 = (pAVar14->super_MessageLite)._internal_metadata_.ptr_;
    pAVar26 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    pAVar15 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ActivationReLU>
                        (pAVar26);
    (pAVar14->NonlinearityType_).relu_ = pAVar15;
  }
  uVar5 = (pNVar18->super_MessageLite)._internal_metadata_.ptr_;
  puVar24 = (undefined8 *)(uVar5 & 0xfffffffffffffffc);
  if ((uVar5 & 1) != 0) {
    puVar24 = (undefined8 *)*puVar24;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar18->name_,"relu",puVar24);
  pRVar4 = (pNVar18->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001acded:
    pbVar19 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar18->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar20 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar18->input_).super_RepeatedPtrFieldBase,pbVar19);
  }
  else {
    iVar1 = (pNVar18->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001acded;
    (pNVar18->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar20 = pRVar4->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar20,0,*(char **)((long)pvVar20 + 8),0x3b8534);
  pRVar4 = (pNVar18->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001ace3d:
    pbVar19 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar18->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar20 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar18->output_).super_RepeatedPtrFieldBase,pbVar19);
  }
  else {
    iVar1 = (pNVar18->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001ace3d;
    (pNVar18->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar20 = pRVar4->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar20,0,*(char **)((long)pvVar20 + 8),0x3d8b56);
  if (local_120._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_120);
    local_120._oneof_case_[0] = 500;
    pAVar26 = (Arena *)(local_120.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_120.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    local_120.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar26);
  }
  TVar7 = local_120.Type_;
  (local_120.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  this_00 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_120.Type_.pipeline_)->models_;
  pRVar4 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_120.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001aced9:
    pNVar18 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar18 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar18);
  }
  else {
    iVar1 = (local_120.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001aced9;
    (local_120.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar1 + 1;
    pNVar18 = (NeuralNetworkLayer *)pRVar4->elements[iVar1];
  }
  uVar5 = (pNVar18->super_MessageLite)._internal_metadata_.ptr_;
  puVar24 = (undefined8 *)(uVar5 & 0xfffffffffffffffc);
  if ((uVar5 & 1) != 0) {
    puVar24 = (undefined8 *)*puVar24;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar18->name_,"for_loop",puVar24);
  if (pNVar18->_oneof_case_[0] != 0x267) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar18);
    pNVar18->_oneof_case_[0] = 0x267;
    uVar5 = (pNVar18->super_MessageLite)._internal_metadata_.ptr_;
    pAVar26 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    pLVar16 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::LoopLayerParams>
                        (pAVar26);
    (pNVar18->layer_).loop_ = pLVar16;
  }
  pCVar6 = (pNVar18->layer_).convolution_;
  if (*(long *)&pCVar6->_kernelsize_cached_byte_size_ == 0) {
    uVar5 = (pCVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar26 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    pNVar17 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>
                        (pAVar26);
    *(NeuralNetwork **)&pCVar6->_kernelsize_cached_byte_size_ = pNVar17;
  }
  CoreML::Specification::NeuralNetwork::CopyFrom
            (*(NeuralNetwork **)&pCVar6->_kernelsize_cached_byte_size_,&local_c8);
  if ((pCVar6->kernelsize_).arena_or_elements_ == (void *)0x0) {
    uVar5 = (pCVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar26 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    pNVar17 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>
                        (pAVar26);
    (pCVar6->kernelsize_).arena_or_elements_ = pNVar17;
  }
  CoreML::Specification::NeuralNetwork::CopyFrom
            ((NeuralNetwork *)(pCVar6->kernelsize_).arena_or_elements_,&local_70);
  pRVar4 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(TVar7.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001acfdc:
    pNVar18 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar18 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar18);
  }
  else {
    iVar1 = (TVar7.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001acfdc;
    (TVar7.treeensembleregressor_)->postevaluationtransform_ = iVar1 + 1;
    pNVar18 = (NeuralNetworkLayer *)pRVar4->elements[iVar1];
  }
  uVar5 = (pNVar18->super_MessageLite)._internal_metadata_.ptr_;
  puVar24 = (undefined8 *)(uVar5 & 0xfffffffffffffffc);
  if ((uVar5 & 1) != 0) {
    puVar24 = (undefined8 *)*puVar24;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar18->name_,"copy",puVar24);
  pRVar4 = (pNVar18->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001ad033:
    pbVar19 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar18->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar20 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar18->input_).super_RepeatedPtrFieldBase,pbVar19);
  }
  else {
    iVar1 = (pNVar18->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001ad033;
    (pNVar18->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar20 = pRVar4->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar20,0,*(char **)((long)pvVar20 + 8),0x3b8534);
  pRVar4 = (pNVar18->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 != (Rep *)0x0) {
    iVar1 = (pNVar18->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar4->allocated_size) {
      (pNVar18->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pvVar20 = pRVar4->elements[iVar1];
      goto LAB_001ad09d;
    }
  }
  pbVar19 = google::protobuf::Arena::Create<std::__cxx11::string>
                      ((pNVar18->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar20 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar18->output_).super_RepeatedPtrFieldBase,pbVar19);
LAB_001ad09d:
  std::__cxx11::string::_M_replace((ulong)pvVar20,0,*(char **)((long)pvVar20 + 8),0x3d8b56);
  if (pNVar18->_oneof_case_[0] != 600) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar18);
    pNVar18->_oneof_case_[0] = 600;
    uVar5 = (pNVar18->super_MessageLite)._internal_metadata_.ptr_;
    pAVar26 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    pCVar21 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::CopyLayerParams>
                        (pAVar26);
    (pNVar18->layer_).copy_ = pCVar21;
  }
  CoreML::validate<(MLModelType)500>(&local_f0,&local_120);
  bVar8 = CoreML::Result::good(&local_f0);
  if (bVar8) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar22 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x11e0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar22,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar22,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar22," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar22 + -0x18) + (char)poVar22);
    std::ostream::put((char)poVar22);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.m_message._M_dataplus._M_p != &local_f0.m_message.field_2) {
    operator_delete(local_f0.m_message._M_dataplus._M_p,
                    local_f0.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::NeuralNetwork::~NeuralNetwork(&local_c8);
  CoreML::Specification::NeuralNetwork::~NeuralNetwork(&local_70);
  CoreML::Specification::Model::~Model(&local_120);
  return (uint)bVar8;
}

Assistant:

int testInvalidLoop2() {
    /*
     condition network present but no condition variable
     */
    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();

    Specification::NeuralNetwork nnCondition;
    auto *l1 = nnCondition.add_layers();
    l1->mutable_greaterthan()->set_alpha(1.0);
    l1->set_name("cond");
    l1->add_input("A");
    l1->add_output("cond");

    Specification::NeuralNetwork nnBody;
    auto *l2 = nnBody.add_layers();
    (void)l2->mutable_activation()->mutable_relu();
    l2->set_name("relu");
    l2->add_input("A");
    l2->add_output("B");

    auto *nnMain = m.mutable_neuralnetwork();
    nnMain->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);
    auto *l3 = nnMain->add_layers();
    l3->set_name("for_loop");
    auto *loop_params = l3->mutable_loop();
    loop_params->mutable_bodynetwork()->CopyFrom(nnBody);
    loop_params->mutable_conditionnetwork()->CopyFrom(nnCondition);

    auto *l4 = nnMain->add_layers();
    l4->set_name("copy");
    l4->add_input("A");
    l4->add_output("B");
    (void) l4->mutable_copy();

    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    return 0;
}